

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

_Bool al_peek_next_event(ALLEGRO_EVENT_QUEUE *queue,ALLEGRO_EVENT *ret_event)

{
  ALLEGRO_EVENT *src;
  ALLEGRO_EVENT *in_RSI;
  ALLEGRO_EVENT_QUEUE *in_RDI;
  ALLEGRO_EVENT *next_event;
  
  heartbeat();
  _al_mutex_lock((_AL_MUTEX *)0x174581);
  src = get_next_event_if_any(in_RDI,SUB81((ulong)in_RSI >> 0x38,0));
  if (src != (ALLEGRO_EVENT *)0x0) {
    copy_event(in_RSI,src);
    ref_if_user_event(in_RSI);
  }
  _al_mutex_unlock((_AL_MUTEX *)0x1745be);
  return src != (ALLEGRO_EVENT *)0x0;
}

Assistant:

bool al_peek_next_event(ALLEGRO_EVENT_QUEUE *queue, ALLEGRO_EVENT *ret_event)
{
   ALLEGRO_EVENT *next_event;
   ASSERT(queue);
   ASSERT(ret_event);

   heartbeat();

   _al_mutex_lock(&queue->mutex);

   next_event = get_next_event_if_any(queue, false);
   if (next_event) {
      copy_event(ret_event, next_event);
      ref_if_user_event(ret_event);
   }

   _al_mutex_unlock(&queue->mutex);

   return (next_event ? true : false);
}